

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateJSONEncodingAPIs
          (SwiftGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  int *piVar1;
  int iVar2;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"extension {{STRUCTNAME}}: Encodable {",&local_d9);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_d9);
  CodeWriter::operator+=(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if ((struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GenerateCodingKeys(this,struct_def);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"{{ACCESS_TYPE}} func encode(to encoder: Encoder) throws {",
             &local_d9);
  CodeWriter::operator+=(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  iVar2 = (this->code_).cur_ident_lvl_ + 1;
  (this->code_).cur_ident_lvl_ = iVar2;
  if ((struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GenerateEncoderBody(this,struct_def);
    iVar2 = (this->code_).cur_ident_lvl_;
  }
  if (iVar2 != 0) {
    (this->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"}",&local_d9);
  CodeWriter::operator+=(this_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  iVar2 = (this->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (this->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"}",&local_d9);
  CodeWriter::operator+=(this_00,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
  CodeWriter::operator+=(this_00,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void GenerateJSONEncodingAPIs(const StructDef &struct_def) {
    code_ += "extension {{STRUCTNAME}}: Encodable {";
    Indent();
    code_ += "";
    if (struct_def.fields.vec.empty() == false) GenerateCodingKeys(struct_def);

    code_ += "{{ACCESS_TYPE}} func encode(to encoder: Encoder) throws {";
    Indent();
    if (struct_def.fields.vec.empty() == false) GenerateEncoderBody(struct_def);
    Outdent();
    code_ += "}";
    Outdent();
    code_ += "}";
    code_ += "";
  }